

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O0

int BN_mul_word(BIGNUM *a,ulong w)

{
  int iVar1;
  BIGNUM *a_00;
  BIGNUM *pBVar2;
  unsigned_long ll;
  int in_stack_ffffffffffffffdc;
  
  if (a->top != 0) {
    if (w == 0) {
      BN_zero_ex((BIGNUM *)a);
    }
    else {
      a_00 = (BIGNUM *)bn_mul_words(a->d,a->d,a->top,w);
      if (a_00 != (BIGNUM *)0x0) {
        pBVar2 = bn_wexpand(a_00,in_stack_ffffffffffffffdc);
        if (pBVar2 == (BIGNUM *)0x0) {
          return 0;
        }
        iVar1 = a->top;
        a->top = iVar1 + 1;
        a->d[iVar1] = (ulong)a_00;
      }
    }
  }
  return 1;
}

Assistant:

int BN_mul_word(BIGNUM *a, BN_ULONG w)
{
    BN_ULONG ll;

    bn_check_top(a);
    w &= BN_MASK2;
    if (a->top) {
        if (w == 0)
            BN_zero(a);
        else {
            ll = bn_mul_words(a->d, a->d, a->top, w);
            if (ll) {
                if (bn_wexpand(a, a->top + 1) == NULL)
                    return (0);
                a->d[a->top++] = ll;
            }
        }
    }
    bn_check_top(a);
    return (1);
}